

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
pstore::dump::string::write_unquoted<std::wostream>
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,string *v)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  reference pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  value_type front;
  string *v_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    pcVar4 = (char *)std::__cxx11::string::front();
    if ((*pcVar4 == '\"') || (*pcVar4 == '!')) {
      std::operator<<(os,"\\");
    }
  }
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar1 = *pcVar5;
    if (cVar1 == '\\') {
      std::operator<<(os,'\\');
    }
    std::operator<<(os,cVar1);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }